

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::checkOverallStructureOfProcessor(ProcessorBase *processorOrGraph)

{
  ModuleBase *pMVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  Processor *pPVar5;
  undefined4 extraout_var;
  Function *pFVar6;
  Expression *pEVar7;
  Function *pFVar8;
  Identifier *args;
  Identifier *args_00;
  CompileMessage local_1a0;
  CompileMessage local_168;
  anon_class_8_1_532db2b7 local_130;
  anon_class_8_1_532db2b7 hasAnEventEndpoint;
  anon_class_8_1_532db2b7 areAllEndpointsResolved;
  CompileMessage local_e8;
  Type local_b0;
  pool_ref<soul::AST::Function> *local_98;
  pool_ref<soul::AST::Function> *f;
  pool_ref<soul::AST::Function> *__end3;
  pool_ref<soul::AST::Function> *__begin3;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *local_70;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *__range3;
  int numRunFunctions;
  pool_ptr<soul::AST::Processor> processor;
  CompileMessage local_48;
  ProcessorBase *local_10;
  ProcessorBase *processorOrGraph_local;
  
  local_10 = processorOrGraph;
  sVar4 = AST::ModuleBase::getNumOutputs(&processorOrGraph->super_ModuleBase);
  if (sVar4 == 0) {
    pMVar1 = &local_10->super_ModuleBase;
    Errors::processorNeedsAnOutput<>();
    AST::Context::throwError(&(pMVar1->super_ASTObject).context,&local_48,false);
  }
  cast<soul::AST::Processor,soul::AST::ProcessorBase>((soul *)&stack0xffffffffffffffa0,local_10);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&stack0xffffffffffffffa0);
  if (bVar2) {
    __range3._4_4_ = 0;
    pPVar5 = pool_ptr<soul::AST::Processor>::operator->
                       ((pool_ptr<soul::AST::Processor> *)&stack0xffffffffffffffa0);
    iVar3 = (*(pPVar5->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[0x16])
                      ();
    __begin3 = (pool_ref<soul::AST::Function> *)CONCAT44(extraout_var,iVar3);
    local_70 = (ArrayView<soul::pool_ref<soul::AST::Function>_> *)&__begin3;
    __end3 = ArrayView<soul::pool_ref<soul::AST::Function>_>::begin(local_70);
    f = ArrayView<soul::pool_ref<soul::AST::Function>_>::end(local_70);
    for (; __end3 != f; __end3 = __end3 + 1) {
      local_98 = __end3;
      pFVar6 = pool_ref<soul::AST::Function>::operator->(__end3);
      bVar2 = AST::Function::isRunFunction(pFVar6);
      if (bVar2) {
LAB_0039f0e3:
        pFVar6 = pool_ref<soul::AST::Function>::operator->(local_98);
        pEVar7 = pool_ptr<soul::AST::Expression>::operator->(&pFVar6->returnType);
        (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[5])(&local_b0);
        bVar2 = Type::isVoid(&local_b0);
        Type::~Type(&local_b0);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          pFVar6 = pool_ref<soul::AST::Function>::operator->(local_98);
          pFVar8 = pool_ref<soul::AST::Function>::operator->(local_98);
          Errors::functionMustBeVoid<soul::Identifier&>(&local_e8,(Errors *)&pFVar8->name,args);
          AST::Context::throwError(&(pFVar6->super_ASTObject).context,&local_e8,false);
        }
        pFVar6 = pool_ref<soul::AST::Function>::operator->(local_98);
        bVar2 = std::
                vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                ::empty(&pFVar6->parameters);
        if (!bVar2) {
          pFVar6 = pool_ref<soul::AST::Function>::operator->(local_98);
          pFVar8 = pool_ref<soul::AST::Function>::operator->(local_98);
          Errors::functionHasParams<soul::Identifier&>
                    ((CompileMessage *)&areAllEndpointsResolved,(Errors *)&pFVar8->name,args_00);
          AST::Context::throwError
                    (&(pFVar6->super_ASTObject).context,(CompileMessage *)&areAllEndpointsResolved,
                     false);
        }
        pFVar6 = pool_ref<soul::AST::Function>::operator->(local_98);
        bVar2 = AST::Function::isRunFunction(pFVar6);
        if (bVar2) {
          __range3._4_4_ = __range3._4_4_ + 1;
        }
      }
      else {
        pFVar6 = pool_ref<soul::AST::Function>::operator->(local_98);
        bVar2 = AST::Function::isUserInitFunction(pFVar6);
        if (bVar2) goto LAB_0039f0e3;
      }
    }
    if (__range3._4_4_ == 0) {
      hasAnEventEndpoint.processorOrGraph = local_10;
      local_130.processorOrGraph = local_10;
      bVar2 = checkOverallStructureOfProcessor::anon_class_8_1_532db2b7::operator()
                        (&hasAnEventEndpoint);
      if ((bVar2) &&
         (bVar2 = checkOverallStructureOfProcessor::anon_class_8_1_532db2b7::operator()(&local_130),
         !bVar2)) {
        pPVar5 = pool_ptr<soul::AST::Processor>::operator->
                           ((pool_ptr<soul::AST::Processor> *)&stack0xffffffffffffffa0);
        Errors::processorNeedsRunFunction<>();
        AST::Context::throwError
                  (&(pPVar5->super_ProcessorBase).super_ModuleBase.super_ASTObject.context,
                   &local_168,false);
      }
    }
    if (1 < __range3._4_4_) {
      pPVar5 = pool_ptr<soul::AST::Processor>::operator->
                         ((pool_ptr<soul::AST::Processor> *)&stack0xffffffffffffffa0);
      Errors::multipleRunFunctions<>();
      AST::Context::throwError
                (&(pPVar5->super_ProcessorBase).super_ModuleBase.super_ASTObject.context,&local_1a0,
                 false);
    }
  }
  pool_ptr<soul::AST::Processor>::~pool_ptr
            ((pool_ptr<soul::AST::Processor> *)&stack0xffffffffffffffa0);
  return;
}

Assistant:

static void checkOverallStructureOfProcessor (AST::ProcessorBase& processorOrGraph)
    {
        if (processorOrGraph.getNumOutputs() == 0)
            processorOrGraph.context.throwError (Errors::processorNeedsAnOutput());

        if (auto processor = cast<AST::Processor> (processorOrGraph))
        {
            int numRunFunctions = 0;

            for (auto& f : processor->getFunctions())
            {
                if (f->isRunFunction() || f->isUserInitFunction())
                {
                    if (! f->returnType->resolveAsType().isVoid())
                        f->context.throwError (Errors::functionMustBeVoid (f->name));

                    if (! f->parameters.empty())
                        f->context.throwError (Errors::functionHasParams (f->name));

                    if (f->isRunFunction())
                        ++numRunFunctions;
                }
            }

            // If the processor has non-event I/O then we need a run processor
            if (numRunFunctions == 0)
            {
                auto areAllEndpointsResolved = [&]
                {
                    for (auto e : processorOrGraph.getEndpoints())
                        if (! e->isResolved())
                            return false;

                    return true;
                };

                auto hasAnEventEndpoint = [&]
                {
                    for (auto e : processorOrGraph.getEndpoints())
                        if (isEvent (e->getDetails()))
                            return true;

                    return false;
                };

                if (areAllEndpointsResolved() && ! hasAnEventEndpoint())
                    processor->context.throwError (Errors::processorNeedsRunFunction());
            }

            if (numRunFunctions > 1)
                processor->context.throwError (Errors::multipleRunFunctions());
        }
    }